

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O0

ActionMessage * __thiscall
helics::ActionMessage::operator=
          (ActionMessage *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  pointer pMVar1;
  SmallBuffer *in_RSI;
  ActionMessage *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff20;
  undefined1 *puVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  SmallBuffer *sb;
  SmallBuffer *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_20;
  
  in_RDI->messageAction = cmd_send_message;
  sb = in_RSI;
  pMVar1 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                     ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5e9891
                     );
  in_RDI->messageID = pMVar1->messageID;
  pMVar1 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                     ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5e98a9
                     );
  in_RDI->flags = pMVar1->flags;
  std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5e98c3);
  SmallBuffer::operator=(in_stack_ffffffffffffff48,sb);
  pMVar1 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                     ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5e98e2
                     );
  (in_RDI->actionTime).internalTimeCode = (pMVar1->time).internalTimeCode;
  std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5e98fb);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sb,
             in_stack_ffffffffffffff38);
  puVar3 = local_80;
  std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5e9925);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sb,
             in_stack_ffffffffffffff38);
  pbVar2 = local_60;
  std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5e9950);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sb,pbVar2);
  std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5e997b);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sb,pbVar2);
  local_20._M_string_length = 4;
  __l._M_len = (size_type)puVar3;
  __l._M_array = (iterator)in_RSI;
  local_20._M_dataplus._M_p = (pointer)&local_a0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffff20,__l);
  pbVar2 = &local_20;
  do {
    pbVar2 = pbVar2 + -1;
    std::__cxx11::string::~string(pbVar2);
  } while (pbVar2 != &local_a0);
  return in_RDI;
}

Assistant:

ActionMessage& ActionMessage::operator=(std::unique_ptr<Message> message) noexcept
{
    messageAction = CMD_SEND_MESSAGE;
    messageID = message->messageID;
    flags = message->flags;
    payload = std::move(message->data);
    actionTime = message->time;
    stringData = {std::move(message->dest),
                  std::move(message->source),
                  std::move(message->original_source),
                  std::move(message->original_dest)};
    return *this;
}